

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataItem.cpp
# Opt level: O1

void __thiscall DataItem::DataItem(DataItem *this,int v)

{
  _Rb_tree_header *p_Var1;
  
  this->value = v;
  p_Var1 = &(this->read_list)._M_t._M_impl.super__Rb_tree_header;
  (this->read_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->read_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->read_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->read_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->read_list)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  return;
}

Assistant:

DataItem::DataItem(int v): value(v) {}